

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_count_quantity.cpp
# Opt level: O1

void __thiscall
polyscope::SurfaceVertexIsolatedScalarQuantity::SurfaceVertexIsolatedScalarQuantity
          (SurfaceVertexIsolatedScalarQuantity *this,string *name,
          vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
          *values_,SurfaceMesh *mesh_)

{
  _Rb_tree_header *p_Var1;
  pointer *pppVar2;
  mapped_type_conflict1 mVar3;
  pointer pcVar4;
  pointer ppVar5;
  pointer pvVar6;
  iterator __position;
  mapped_type_conflict1 *pmVar7;
  SurfaceMesh *pSVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  _Rb_tree_header *p_Var11;
  key_type_conflict *__k;
  pair<unsigned_long,_double> *t;
  pointer ppVar12;
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  newValues;
  map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  m;
  unsigned_long local_d0;
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  local_c8;
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  *local_a8;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_double>,_std::_Select1st<std::pair<const_unsigned_long,_double>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
  local_a0;
  string local_70;
  string local_50;
  
  pcVar4 = (name->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar4,pcVar4 + name->_M_string_length);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"isolated vertex scalar","");
  SurfaceCountQuantity::SurfaceCountQuantity
            (&this->super_SurfaceCountQuantity,&local_50,mesh_,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (this->super_SurfaceCountQuantity).super_SurfaceMeshQuantity.
  super_Quantity<polyscope::SurfaceMesh>._vptr_Quantity =
       (_func_int **)&PTR__SurfaceVertexIsolatedScalarQuantity_004bad60;
  p_Var1 = &(this->values)._M_t._M_impl.super__Rb_tree_header;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pSVar8 = (this->super_SurfaceCountQuantity).super_SurfaceMeshQuantity.
           super_Quantity<polyscope::SurfaceMesh>.parent;
  if ((pSVar8->vertexPerm).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_finish !=
      (pSVar8->vertexPerm).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_start) {
    p_Var1 = &local_a0._M_impl.super__Rb_tree_header;
    local_a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a0._M_impl.super__Rb_tree_header._M_node_count = 0;
    ppVar12 = (values_->
              super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppVar5 = (values_->
             super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    local_a8 = values_;
    local_a0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_a0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    if (ppVar12 != ppVar5) {
      do {
        mVar3 = ppVar12->second;
        pmVar7 = std::
                 map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
                 ::operator[]((map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
                               *)&local_a0,&ppVar12->first);
        *pmVar7 = mVar3;
        ppVar12 = ppVar12 + 1;
      } while (ppVar12 != ppVar5);
    }
    local_c8.
    super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.
    super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.
    super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d0 = 0;
    pSVar8 = (this->super_SurfaceCountQuantity).super_SurfaceMeshQuantity.
             super_Quantity<polyscope::SurfaceMesh>.parent;
    if ((pSVar8->vertices).
        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (pSVar8->vertices).
        super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      do {
        __k = (pSVar8->vertexPerm).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
              ._M_impl.super__Vector_impl_data._M_start + local_d0;
        p_Var9 = &p_Var1->_M_header;
        if (local_a0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          p_Var10 = local_a0._M_impl.super__Rb_tree_header._M_header._M_parent;
          do {
            if (*(ulong *)(p_Var10 + 1) >= *__k) {
              p_Var9 = p_Var10;
            }
            p_Var10 = (&p_Var10->_M_left)[*(ulong *)(p_Var10 + 1) < *__k];
          } while (p_Var10 != (_Base_ptr)0x0);
        }
        p_Var11 = p_Var1;
        if (((_Rb_tree_header *)p_Var9 != p_Var1) &&
           (p_Var11 = (_Rb_tree_header *)p_Var9, *__k < ((_Rb_tree_header *)p_Var9)->_M_node_count))
        {
          p_Var11 = p_Var1;
        }
        if (p_Var11 != p_Var1) {
          pmVar7 = std::
                   map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
                   ::operator[]((map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
                                 *)&local_a0,__k);
          std::
          vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>::
          emplace_back<unsigned_long&,double&>
                    ((vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>
                      *)&local_c8,&local_d0,pmVar7);
        }
        local_d0 = local_d0 + 1;
        pSVar8 = (this->super_SurfaceCountQuantity).super_SurfaceMeshQuantity.
                 super_Quantity<polyscope::SurfaceMesh>.parent;
      } while (local_d0 <
               (ulong)(((long)(pSVar8->vertices).
                              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pSVar8->vertices).
                              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555)
              );
    }
    values_ = local_a8;
    std::
    vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>::
    operator=(local_a8,&local_c8);
    if (local_c8.
        super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c8.
                      super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_double>,_std::_Select1st<std::pair<const_unsigned_long,_double>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
    ::~_Rb_tree(&local_a0);
  }
  ppVar12 = (values_->
            super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppVar5 = (values_->
           super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar12 != ppVar5) {
    do {
      mVar3 = ppVar12->second;
      pmVar7 = std::
               map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
               ::operator[](&this->values,&ppVar12->first);
      *pmVar7 = mVar3;
      pvVar6 = (((this->super_SurfaceCountQuantity).super_SurfaceMeshQuantity.
                 super_Quantity<polyscope::SurfaceMesh>.parent)->vertices).
               super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_a0._M_impl.super__Rb_tree_header._M_header._M_color =
           *(_Rb_tree_color *)&pvVar6[ppVar12->first].field_2;
      pvVar6 = pvVar6 + ppVar12->first;
      local_a0._M_impl._0_4_ = pvVar6->field_0;
      local_a0._M_impl._4_4_ = pvVar6->field_1;
      local_a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)ppVar12->second;
      __position._M_current =
           (this->super_SurfaceCountQuantity).entries.
           super__Vector_base<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>,_std::allocator<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->super_SurfaceCountQuantity).entries.
          super__Vector_base<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>,_std::allocator<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::pair<glm::vec<3,float,(glm::qualifier)0>,double>,std::allocator<std::pair<glm::vec<3,float,(glm::qualifier)0>,double>>>
        ::_M_realloc_insert<std::pair<glm::vec<3,float,(glm::qualifier)0>,double>>
                  ((vector<std::pair<glm::vec<3,float,(glm::qualifier)0>,double>,std::allocator<std::pair<glm::vec<3,float,(glm::qualifier)0>,double>>>
                    *)&(this->super_SurfaceCountQuantity).entries,__position,
                   (pair<glm::vec<3,_float,_(glm::qualifier)0>,_double> *)&local_a0);
      }
      else {
        (__position._M_current)->second =
             (double)local_a0._M_impl.super__Rb_tree_header._M_header._M_parent;
        ((__position._M_current)->first).field_0 =
             (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)local_a0._M_impl._0_4_;
        ((__position._M_current)->first).field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_a0._M_impl._4_4_;
        *(ulong *)&((__position._M_current)->first).field_2 =
             CONCAT44(local_a0._M_impl.super__Rb_tree_header._M_header._4_4_,
                      local_a0._M_impl.super__Rb_tree_header._M_header._M_color);
        pppVar2 = &(this->super_SurfaceCountQuantity).entries.
                   super__Vector_base<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>,_std::allocator<std::pair<glm::vec<3,_float,_(glm::qualifier)0>,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pppVar2 = *pppVar2 + 1;
      }
      ppVar12 = ppVar12 + 1;
    } while (ppVar12 != ppVar5);
  }
  SurfaceCountQuantity::initializeLimits(&this->super_SurfaceCountQuantity);
  return;
}

Assistant:

SurfaceVertexIsolatedScalarQuantity::SurfaceVertexIsolatedScalarQuantity(std::string name,
                                                                         std::vector<std::pair<size_t, double>> values_,
                                                                         SurfaceMesh& mesh_)
    : SurfaceCountQuantity(name, mesh_, "isolated vertex scalar")

{

  // Apply permutation if needed
  if (parent.vertexPerm.size() > 0) {

    // Build a temporary map to invert
    std::map<size_t, double> m;
    for (auto& t : values_) {
      m[t.first] = t.second;
    }

    // Invert
    std::vector<std::pair<size_t, double>> newValues;
    for (size_t iP = 0; iP < parent.nVertices(); iP++) {
      if (m.find(parent.vertexPerm[iP]) != m.end()) {
        newValues.emplace_back(iP, m[parent.vertexPerm[iP]]);
      }
    }

    values_ = newValues;
  }

  for (auto& t : values_) {
    values[t.first] = t.second;
    entries.push_back(std::make_pair(parent.vertices[t.first], t.second));
  }

  initializeLimits();
}